

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.h
# Opt level: O2

bool __thiscall
rlottie::internal::renderer::Polystar::hasChanged(Polystar *this,int prevFrame,int curFrame)

{
  bool bVar1;
  
  bVar1 = model::Property<VPointF,_void>::changed(&this->mData->mPos,prevFrame,curFrame);
  if (!bVar1) {
    bVar1 = model::Property<float,_void>::changed(&this->mData->mPointCount,prevFrame,curFrame);
    if (!bVar1) {
      bVar1 = model::Property<float,_void>::changed(&this->mData->mInnerRadius,prevFrame,curFrame);
      if (!bVar1) {
        bVar1 = model::Property<float,_void>::changed(&this->mData->mOuterRadius,prevFrame,curFrame)
        ;
        if (!bVar1) {
          bVar1 = model::Property<float,_void>::changed
                            (&this->mData->mInnerRoundness,prevFrame,curFrame);
          if (!bVar1) {
            bVar1 = model::Property<float,_void>::changed
                              (&this->mData->mOuterRoundness,prevFrame,curFrame);
            if (!bVar1) {
              bVar1 = model::Property<float,_void>::changed
                                (&this->mData->mRotation,prevFrame,curFrame);
              return bVar1;
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool hasChanged(int prevFrame, int curFrame) final
    {
        return (mData->mPos.changed(prevFrame, curFrame) ||
                mData->mPointCount.changed(prevFrame, curFrame) ||
                mData->mInnerRadius.changed(prevFrame, curFrame) ||
                mData->mOuterRadius.changed(prevFrame, curFrame) ||
                mData->mInnerRoundness.changed(prevFrame, curFrame) ||
                mData->mOuterRoundness.changed(prevFrame, curFrame) ||
                mData->mRotation.changed(prevFrame, curFrame));
    }